

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall MarkerIndex::Iterator::reset(Iterator *this)

{
  Point local_20;
  Point local_18;
  Iterator *local_10;
  Iterator *this_local;
  
  this->current_node = this->marker_index->root;
  if (this->current_node != (Node *)0x0) {
    this->current_node_position = this->current_node->left_extent;
  }
  local_10 = this;
  Point::Point(&local_18,0,0);
  this->left_ancestor_position = local_18;
  Point::Point(&local_20,0xffffffff,0xffffffff);
  this->right_ancestor_position = local_20;
  std::vector<Point,_std::allocator<Point>_>::clear(&this->left_ancestor_position_stack);
  std::vector<Point,_std::allocator<Point>_>::clear(&this->right_ancestor_position_stack);
  return;
}

Assistant:

void MarkerIndex::Iterator::reset() {
  current_node = marker_index->root;
  if (current_node) {
    current_node_position = current_node->left_extent;
  }
  left_ancestor_position = Point(0, 0);
  right_ancestor_position = Point(UINT32_MAX, UINT32_MAX);
  left_ancestor_position_stack.clear();
  right_ancestor_position_stack.clear();
}